

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O3

void __thiscall indigox::ElectronOpt::DeterminePotentialElectronLocations(ElectronOpt *this)

{
  StoredVertexList *pSVar1;
  pointer *pppVar2;
  long lVar3;
  iterator iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  ulong uVar8;
  _Atomic_word _Var9;
  vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>> *this_00;
  AdjList *g;
  ElnVertex pvVar10;
  uint uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  char cVar13;
  char cVar14;
  long *plVar15;
  element_type *peVar16;
  bool bVar17;
  MolVertPair id_00;
  MolVertPair id;
  pair<void_*,_void_*> local_50;
  element_type *local_40;
  vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>> *local_38;
  
  local_40 = (((this->molGraph_).
               super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__MolGraph).graph_.
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  pSVar1 = (StoredVertexList *)((long)&local_40->super_type + 0x18);
  plVar15 = *(long **)&((StoredVertexList *)((long)&local_40->super_type + 0x18))->
                       super__List_base<void_*,_std::allocator<void_*>_>;
  if ((StoredVertexList *)plVar15 != pSVar1) {
    local_40 = (element_type *)pSVar1;
    do {
      lVar3 = plVar15[2];
      if (*(ulong *)(lVar3 + 0x28) < 3) {
        Atom::GetElement(*(Atom **)(lVar3 + 0x30));
        cVar13 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 4);
      }
      else {
        Atom::GetElement(*(Atom **)(lVar3 + 0x30));
        cVar13 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second);
      }
      local_50.first = (void *)plVar15[2];
      _Var9 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_50.first + 0x20))->
              _M_use_count;
      id_00.second = local_50.first;
      id_00.first = local_50.first;
      local_50.second = local_50.first;
      pvVar10 = ElectronGraph::GetVertex
                          ((this->elnGraph_).
                           super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,id_00);
      cVar13 = cVar13 - ((char)_Var9 * '\x02' + *(char *)((long)pvVar10 + 0x47));
      if ('\0' < cVar13) {
        do {
          iVar4._M_current =
               (this->possibleLocations_).
               super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->possibleLocations_).
              super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>::
            _M_realloc_insert<std::pair<void*,void*>const&>
                      ((vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>> *)
                       &this->possibleLocations_,iVar4,&local_50);
          }
          else {
            (iVar4._M_current)->first = local_50.first;
            (iVar4._M_current)->second = local_50.second;
            pppVar2 = &(this->possibleLocations_).
                       super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
          bVar17 = SCARRY1(cVar13,~Options::AssignElectrons::USE_ELECTRON_PAIRS);
          cVar13 = cVar13 + ~Options::AssignElectrons::USE_ELECTRON_PAIRS;
        } while (cVar13 != '\0' && bVar17 == cVar13 < '\0');
      }
      plVar15 = (long *)*plVar15;
    } while ((element_type *)plVar15 != local_40);
    local_40 = (((this->molGraph_).
                 super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super__MolGraph).graph_.
               super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  }
  peVar16 = *(element_type **)&local_40->super_type;
  if (peVar16 != local_40) {
    local_38 = (vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>> *)
               &this->possibleLocations_;
    do {
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&peVar16->super_type + 0x10)
      ;
      p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                &((StoredVertexList *)((long)&peVar16->super_type + 0x18))->
                 super__List_base<void_*,_std::allocator<void_*>_>;
      p_Var12 = p_Var5;
      if (p_Var6 < p_Var5) {
        p_Var12 = p_Var6;
        p_Var6 = p_Var5;
      }
      uVar7._0_4_ = p_Var12[2]._M_use_count;
      uVar7._4_4_ = p_Var12[2]._M_weak_count;
      if (uVar7 < 3) {
        Atom::GetElement((Atom *)p_Var12[3]._vptr__Sp_counted_base);
        cVar13 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 4);
      }
      else {
        Atom::GetElement((Atom *)p_Var12[3]._vptr__Sp_counted_base);
        cVar13 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second);
      }
      uVar8._0_4_ = p_Var6[2]._M_use_count;
      uVar8._4_4_ = p_Var6[2]._M_weak_count;
      if (uVar8 < 3) {
        Atom::GetElement((Atom *)p_Var6[3]._vptr__Sp_counted_base);
        cVar14 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 4);
      }
      else {
        Atom::GetElement((Atom *)p_Var6[3]._vptr__Sp_counted_base);
        cVar14 = *(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_50.first + 0x40))->_vptr__Sp_counted_base + 5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.second);
      }
      this_00 = local_38;
      cVar13 = cVar13 + (char)p_Var12[2]._M_use_count * -2;
      local_50.first = p_Var12;
      local_50.second = p_Var6;
      if (('\0' < cVar13) && (cVar14 = cVar14 + (char)p_Var6[2]._M_use_count * -2, '\0' < cVar14)) {
        uVar11 = 0;
        do {
          uVar11 = uVar11 + 1;
          if (Options::AssignElectrons::MAXIMUM_BOND_ORDER < uVar11) break;
          iVar4._M_current =
               (this->possibleLocations_).
               super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->possibleLocations_).
              super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>::
            _M_realloc_insert<std::pair<void*,void*>const&>(this_00,iVar4,&local_50);
          }
          else {
            (iVar4._M_current)->first = local_50.first;
            (iVar4._M_current)->second = local_50.second;
            pppVar2 = &(this->possibleLocations_).
                       super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
          if (Options::AssignElectrons::USE_ELECTRON_PAIRS == false) {
            iVar4._M_current =
                 (this->possibleLocations_).
                 super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->possibleLocations_).
                super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>::
              _M_realloc_insert<std::pair<void*,void*>const&>(this_00,iVar4,&local_50);
            }
            else {
              (iVar4._M_current)->first = local_50.first;
              (iVar4._M_current)->second = local_50.second;
              pppVar2 = &(this->possibleLocations_).
                         super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
          }
          if (cVar13 < '\x03') break;
          cVar13 = cVar13 + -2;
          bVar17 = '\x02' < cVar14;
          cVar14 = cVar14 + -2;
        } while (bVar17);
      }
      peVar16 = *(element_type **)&peVar16->super_type;
    } while (peVar16 != local_40);
  }
  return;
}

Assistant:

void ElectronOpt::DeterminePotentialElectronLocations() {
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v) {
    int8_t octet;
    if (molGraph_->Degree(*v) > 2)
      octet = molGraph_->GetProperties(*v)->atom->GetElement()->GetHypervalentOctet();
    else
      octet = molGraph_->GetProperties(*v)->atom->GetElement()->GetOctet();
    
    int8_t bondedElectrons = 2 * molGraph_->Degree(*v);
    int8_t missingElectrons = octet - bondedElectrons;
    
    MolVertPair id = std::make_pair(*v, *v);
    // Preplace code
    ElnVertex ev = elnGraph_->GetVertex(id);
    missingElectrons -= elnGraph_->GetProperties(ev)->pre_placed;
    // End Preplace code
    
    while (missingElectrons > 0) {
      possibleLocations_.push_back(id);
      if (opt_::USE_ELECTRON_PAIRS)
        missingElectrons -= 2;
      else
        missingElectrons -= 1;
    }
  }
  
  MolEdgeIterPair es = molGraph_->GetEdges();
  for (MolEdgeIter e = es.first; e != es.second; ++e) {
    MolVertex u = molGraph_->GetSource(*e);
    MolVertex v = molGraph_->GetTarget(*e);
    if (u > v) {
      MolVertex tmp = u;
      u = v;
      v = tmp;
    }
    int8_t u_oct, v_oct, u_bond, v_bond, u_miss, v_miss;
    if (molGraph_->Degree(u) > 2)
      u_oct = molGraph_->GetProperties(u)->atom->GetElement()->GetHypervalentOctet();
    else
      u_oct = molGraph_->GetProperties(u)->atom->GetElement()->GetOctet();
    if (molGraph_->Degree(v) > 2)
      v_oct = molGraph_->GetProperties(v)->atom->GetElement()->GetHypervalentOctet();
    else
      v_oct = molGraph_->GetProperties(v)->atom->GetElement()->GetOctet();
    u_bond = 2 * molGraph_->Degree(u);
    v_bond = 2 * molGraph_->Degree(v);
    u_miss = u_oct - u_bond;
    v_miss = v_oct - v_bond;
    uint8_t order = 1;
    MolVertPair id = std::make_pair(u, v);
    // TODO: Check energy tables for available bond orders
    while (u_miss > 0 && v_miss > 0 && order <= opt_::MAXIMUM_BOND_ORDER) {
      possibleLocations_.push_back(id);
      if (!opt_::USE_ELECTRON_PAIRS)
        possibleLocations_.push_back(id);
      u_miss -= 2;
      v_miss -= 2;
      order++;
    }
  }
}